

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O3

void __thiscall xray_re::xr_mesh_builder::commit(xr_mesh_builder *this,xr_object *object)

{
  xr_surfmap_vec *this_00;
  pointer *pppxVar1;
  lw_face_vec *this_01;
  pointer *pplVar2;
  pointer pxVar3;
  iterator __position;
  pointer p_Var4;
  pointer p_Var5;
  pointer pbVar6;
  pointer pbVar7;
  pointer puVar8;
  pointer puVar9;
  pointer pbVar10;
  iterator __position_00;
  iterator __position_01;
  pointer p_Var11;
  pointer p_Var12;
  pointer p_Var13;
  pointer p_Var14;
  xr_surfmap *pxVar15;
  xr_surface *pxVar16;
  ulong uVar17;
  pointer raw_surface;
  xr_raw_surface_vec *pxVar18;
  pointer pbVar19;
  uint32_t face_idx;
  xr_surfmap *smap;
  uint local_5c;
  xr_object *local_58;
  anon_union_24_2_ecfd7102_for_lw_face_0 local_50;
  xr_raw_surface_vec *local_38;
  
  local_58 = object;
  compact_raw_surfaces(this);
  this_00 = &(this->super_xr_mesh).m_surfmaps;
  std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::reserve
            (this_00,(long)(this->m_raw_surfaces).
                           super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_raw_surfaces).
                           super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  raw_surface = (this->m_raw_surfaces).
                super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pxVar3 = (this->m_raw_surfaces).
           super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pxVar18 = &this->m_raw_surfaces;
  if (raw_surface != pxVar3) {
    local_38 = &this->m_raw_surfaces;
    do {
      pxVar15 = (xr_surfmap *)operator_new(0x20);
      pxVar16 = xr_object::attach(local_58,raw_surface);
      pxVar15->surface = pxVar16;
      (pxVar15->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pxVar15->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pxVar15->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           (this->super_xr_mesh).m_surfmaps.
           super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_50._0_8_ = pxVar15;
      if (__position._M_current ==
          (this->super_xr_mesh).m_surfmaps.
          super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>::
        _M_realloc_insert<xray_re::xr_surfmap*const&>
                  ((vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>> *)this_00,
                   __position,(xr_surfmap **)&local_50);
      }
      else {
        *__position._M_current = pxVar15;
        pppxVar1 = &(this->super_xr_mesh).m_surfmaps.
                    super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppxVar1 = *pppxVar1 + 1;
      }
      raw_surface = raw_surface + 1;
    } while (raw_surface != pxVar3);
    raw_surface = (local_38->
                  super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pxVar18 = local_38;
  }
  pxVar3 = (this->m_raw_surfaces).
           super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pxVar18->super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar18->super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar18->super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (raw_surface != (pointer)0x0) {
    operator_delete(raw_surface,(long)pxVar3 - (long)raw_surface);
  }
  create_smoothing_groups(this);
  p_Var4 = (this->m_normals).
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var5 = (this->m_normals).
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_normals).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_normals).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_normals).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (p_Var4 != (pointer)0x0) {
    operator_delete(p_Var4,(long)p_Var5 - (long)p_Var4);
  }
  pbVar6 = (this->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (this->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_edges).
  super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_edges).
  super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_edges).
  super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pbVar6 != (pointer)0x0) {
    operator_delete(pbVar6,(long)pbVar7 - (long)pbVar6);
  }
  puVar8 = (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar9 = (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)puVar9 - (long)puVar8);
  }
  this_01 = &(this->super_xr_mesh).m_faces;
  std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::reserve
            (this_01,(long)(this->m_faces).
                           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_faces).
                           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 6);
  local_5c = 0;
  pbVar19 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pbVar19 == pbVar10) {
      generate_vertex_faces(this);
      create_mappings(this,this_01,&(this->super_xr_mesh).m_vmrefs,&(this->super_xr_mesh).m_vmaps,
                      &local_58->m_bones);
      p_Var11 = (this->m_texcoords).
                super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var12 = (this->m_texcoords).
                super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_texcoords).
      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_texcoords).
      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_texcoords).
      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (p_Var11 != (pointer)0x0) {
        operator_delete(p_Var11,(long)p_Var12 - (long)p_Var11);
      }
      p_Var13 = (this->m_influences).
                super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var14 = (this->m_influences).
                super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_influences).
      super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_influences).
      super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_influences).
      super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (p_Var13 != (pointer)0x0) {
        operator_delete(p_Var13,(long)p_Var14 - (long)p_Var13);
      }
      puVar8 = (this->m_vertex_faces).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar9 = (this->m_vertex_faces).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar8 != (pointer)0x0) {
        operator_delete(puVar8,(long)puVar9 - (long)puVar8);
      }
      pbVar19 = (this->m_faces).
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (this->m_faces).
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_faces).
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_faces).
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_faces).
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pbVar19 != (pointer)0x0) {
        operator_delete(pbVar19,(long)pbVar10 - (long)pbVar19);
      }
      xr_mesh::calculate_bbox(&this->super_xr_mesh);
      local_50._0_8_ = this;
      std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>::
      emplace_back<xray_re::xr_mesh*>
                ((vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>> *)&local_58->m_meshes,
                 (xr_mesh **)&local_50);
      return;
    }
    local_50.field_0.v[2] = (pbVar19->field_0).field_0.v[2];
    local_50._0_8_ = *(undefined8 *)&pbVar19->field_0;
    local_50.field_0.ref[0] = 0xffffffff;
    local_50.field_0.ref[1] = 0xffffffff;
    local_50.field_0.ref[2] = 0xffffffff;
    __position_00._M_current =
         (this->super_xr_mesh).m_faces.
         super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->super_xr_mesh).m_faces.
        super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::
      _M_realloc_insert<xray_re::lw_face>(this_01,__position_00,(lw_face *)&local_50.field_0);
    }
    else {
      *(undefined8 *)((long)&(__position_00._M_current)->field_0 + 0x10) = 0xffffffffffffffff;
      *(undefined8 *)&(__position_00._M_current)->field_0 = local_50._0_8_;
      *(ulong *)((long)&(__position_00._M_current)->field_0 + 8) =
           CONCAT44(0xffffffff,local_50.field_0.v[2]);
      pplVar2 = &(this->super_xr_mesh).m_faces.
                 super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *pplVar2 = *pplVar2 + 1;
    }
    uVar17 = (ulong)(pbVar19->field_1).field_1.surf_idx;
    if (uVar17 == 0xffffffff) break;
    pxVar15 = (this_00->
              super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar17];
    __position_01._M_current = *(pointer *)((long)&pxVar15->faces + 8);
    if (__position_01._M_current == *(pointer *)((long)&pxVar15->faces + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pxVar15->faces,__position_01,
                 &local_5c);
    }
    else {
      *__position_01._M_current = local_5c;
      *(uint **)((long)&pxVar15->faces + 8) = __position_01._M_current + 1;
    }
    pbVar19 = pbVar19 + 1;
    local_5c = local_5c + 1;
  }
  __assert_fail("it->surf_idx != BAD_IDX",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                ,0x2a4,"void xray_re::xr_mesh_builder::commit(xr_object &)");
}

Assistant:

void xr_mesh_builder::commit(xr_object& object)
{
	compact_raw_surfaces();
	m_surfmaps.reserve(m_raw_surfaces.size());
	for (xr_raw_surface_vec_it it = m_raw_surfaces.begin(), end = m_raw_surfaces.end();
			it != end; ++it) {
		xr_surfmap* smap = new xr_surfmap(object.attach(*it));
		m_surfmaps.push_back(smap);
	}
	xr_raw_surface_vec().swap(m_raw_surfaces);

	create_smoothing_groups();
	std::vector<fvector3>().swap(m_normals);
	b_edge_vec().swap(m_edges);
	std::vector<uint32_t>().swap(m_vertex_edges);

	xr_mesh::m_faces.reserve(m_faces.size());
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		xr_mesh::m_faces.push_back(lw_face(it->v0, it->v1, it->v2));
		xr_assert(it->surf_idx != BAD_IDX);
		m_surfmaps[it->surf_idx]->faces.push_back(face_idx);
	}

	generate_vertex_faces();
	create_mappings(xr_mesh::m_faces, m_vmrefs, m_vmaps, object.bones());
	std::vector<fvector2>().swap(m_texcoords);
	std::vector<finfluence>().swap(m_influences);
	std::vector<uint32_t>().swap(m_vertex_faces);
	b_face_vec().swap(m_faces);

	calculate_bbox();

	object.meshes().push_back(this);
}